

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall chrono::ChParticleCloud::VariablesQbSetSpeed(ChParticleCloud *this,double step)

{
  ChAparticle *pCVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  pointer ppCVar4;
  uint uVar5;
  ulong uVar6;
  ChVector<double> v;
  double oos;
  double local_108;
  double dStack_100;
  double dStack_f8;
  ChVectorRef *pCStack_f0;
  undefined8 local_e8;
  long local_d8;
  double local_c8;
  double local_c0;
  long local_b8;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double dStack_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double dStack_58;
  double dStack_50;
  ChVector<double> local_48;
  
  ppCVar4 = (this->particles).
            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar4) {
    uVar5 = 1;
    uVar6 = 0;
    local_a8 = 1.0 / step;
    uStack_a0 = 0;
    local_88 = local_a8;
    dStack_80 = local_a8;
    dStack_78 = local_a8;
    dStack_70 = local_a8;
    do {
      pCVar1 = ppCVar4[uVar6];
      local_98 = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.m_data[0];
      dStack_90 = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.m_data[1];
      local_c8 = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.m_data[2];
      local_68 = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.m_data[0];
      dStack_60 = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.m_data[1];
      dStack_58 = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.m_data[2];
      dStack_50 = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.m_data[3];
      ChVariables::Get_qb((ChVectorRef *)&local_c0,(ChVariables *)&pCVar1->variables);
      local_108 = local_c0;
      dStack_100 = 1.48219693752374e-323;
      local_e8 = 0;
      local_d8 = local_b8;
      if (local_b8 < 3) {
LAB_00532f24:
        dStack_100 = 1.48219693752374e-323;
        pCStack_f0 = (ChVectorRef *)&local_c0;
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      pCStack_f0 = (ChVectorRef *)&local_c0;
      ChVector<double>::
      ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                (&local_48,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)&local_108,(type *)0x0);
      (*(pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.super_ChFrame<double>.
        _vptr_ChFrame[7])(pCVar1,&local_48);
      pCVar1 = (this->particles).
               super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar6];
      ChVariables::Get_qb((ChVectorRef *)&local_c0,(ChVariables *)&pCVar1->variables);
      local_108 = (double)((long)local_c0 + 0x18);
      dStack_100 = 1.48219693752374e-323;
      local_e8 = 3;
      local_d8 = local_b8;
      if (local_b8 < 6) goto LAB_00532f24;
      pCStack_f0 = (ChVectorRef *)&local_c0;
      ChVector<double>::
      ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                (&local_48,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)&local_108,(type *)0x0);
      (**(code **)(*(long *)&(pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.
                             super_ChFrame<double> + 0x48))(pCVar1,&local_48);
      if ((step != 0.0) || (NAN(step))) {
        pCVar1 = (this->particles).
                 super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar6];
        auVar2._8_8_ = dStack_90;
        auVar2._0_8_ = local_98;
        auVar2 = vsubpd_avx(*(undefined1 (*) [16])
                             (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos
                             .m_data,auVar2);
        local_108 = auVar2._0_8_ * local_88;
        dStack_100 = auVar2._8_8_ * dStack_80;
        dStack_f8 = ((pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.m_data
                     [2] - local_c8) * local_a8;
        (**(code **)(*(long *)&(pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.
                               super_ChFrame<double> + 0x60))
                  (pCVar1,(MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                           *)&local_108);
        pCVar1 = (this->particles).
                 super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar6];
        auVar3._8_8_ = dStack_60;
        auVar3._0_8_ = local_68;
        auVar3._16_8_ = dStack_58;
        auVar3._24_8_ = dStack_50;
        auVar3 = vsubpd_avx(*(undefined1 (*) [32])
                             (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot
                             .m_data,auVar3);
        local_108 = auVar3._0_8_ * local_88;
        dStack_100 = auVar3._8_8_ * dStack_80;
        dStack_f8 = auVar3._16_8_ * dStack_78;
        pCStack_f0 = (ChVectorRef *)(auVar3._24_8_ * dStack_70);
        (**(code **)(*(long *)&(pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.
                               super_ChFrame<double> + 0x68))
                  (pCVar1,(MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                           *)&local_108);
      }
      ppCVar4 = (this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar6 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar6 < (ulong)((long)(this->particles).
                                   super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 >> 3))
    ;
  }
  return;
}

Assistant:

void ChParticleCloud::VariablesQbSetSpeed(double step) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        ChCoordsys<> old_coord_dt = particles[j]->GetCoord_dt();

        // from 'qb' vector, sets body speed, and updates auxiliary data
        particles[j]->SetPos_dt(particles[j]->variables.Get_qb().segment(0, 3));
        particles[j]->SetWvel_loc(particles[j]->variables.Get_qb().segment(3, 3));

        // apply limits (if in speed clamping mode) to speeds.
        // ClampSpeed(); NO - do only per-particle, here.. (but.. really needed here?)

        // Compute accel. by BDF (approximate by differentiation);
        if (step) {
            particles[j]->SetPos_dtdt((particles[j]->GetCoord_dt().pos - old_coord_dt.pos) / step);
            particles[j]->SetRot_dtdt((particles[j]->GetCoord_dt().rot - old_coord_dt.rot) / step);
        }
    }
}